

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation_capi.cpp
# Opt level: O1

LOTMarkerList * lottie_animation_get_markerlist(Lottie_Animation_S *animation)

{
  undefined1 auVar1 [16];
  pointer ptVar2;
  MarkerList *__x;
  LOTMarkerList *pLVar3;
  LOTMarker *__s;
  char *pcVar4;
  ulong __n;
  ulong uVar5;
  long lVar6;
  size_t *psVar7;
  MarkerList markers;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  local_48;
  
  if (animation == (Lottie_Animation_S *)0x0) {
    pLVar3 = (LOTMarkerList *)0x0;
  }
  else {
    __x = rlottie::Animation::markers_abi_cxx11_
                    ((animation->mAnimation)._M_t.
                     super___uniq_ptr_impl<rlottie::Animation,_std::default_delete<rlottie::Animation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_rlottie::Animation_*,_std::default_delete<rlottie::Animation>_>
                     .super__Head_base<0UL,_rlottie::Animation_*,_false>._M_head_impl);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::vector(&local_48,__x);
    if ((long)local_48.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      pLVar3 = (LOTMarkerList *)0x0;
    }
    else {
      pLVar3 = animation->mMarkerList;
      if (pLVar3 == (LOTMarkerList *)0x0) {
        uVar5 = ((long)local_48.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        pLVar3 = (LOTMarkerList *)operator_new(0x10);
        pLVar3->ptr = (LOTMarker *)0x0;
        pLVar3->size = 0;
        animation->mMarkerList = pLVar3;
        pLVar3->size = uVar5;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5;
        __n = 0xffffffffffffffff;
        if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
          __n = SUB168(auVar1 * ZEXT816(0x18),0);
        }
        __s = (LOTMarker *)operator_new__(__n);
        memset(__s,0,__n);
        pLVar3->ptr = __s;
        if (local_48.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_48.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar6 = uVar5 + (uVar5 == 0);
          psVar7 = &__s->endframe;
          ptVar2 = local_48.
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar4 = strdup((ptVar2->
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            ).
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p);
            ((LOTMarker *)(psVar7 + -2))->name = pcVar4;
            psVar7[-1] = (long)(ptVar2->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                               ).super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                               _M_head_impl;
            *psVar7 = (long)(ptVar2->
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            ).super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                            super__Head_base<2UL,_int,_false>._M_head_impl;
            psVar7 = psVar7 + 3;
            ptVar2 = ptVar2 + 1;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
      }
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::~vector(&local_48);
  }
  return pLVar3;
}

Assistant:

RLOTTIE_API const LOTMarkerList*
lottie_animation_get_markerlist(Lottie_Animation_S *animation)
{
   if (!animation) return nullptr;

   auto markers = animation->mAnimation->markers();
   if (markers.size() == 0) return nullptr;
   if (animation->mMarkerList) return (const LOTMarkerList*)animation->mMarkerList;

   animation->mMarkerList = new LOTMarkerList();
   animation->mMarkerList->size = markers.size();
   animation->mMarkerList->ptr = new LOTMarker[markers.size()]();

   for(size_t i = 0; i < markers.size(); i++) {
       animation->mMarkerList->ptr[i].name = strdup(std::get<0>(markers[i]).c_str());
       animation->mMarkerList->ptr[i].startframe= std::get<1>(markers[i]);
       animation->mMarkerList->ptr[i].endframe= std::get<2>(markers[i]);
   }
   return (const LOTMarkerList*)animation->mMarkerList;
}